

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory
          (DynamicMessageFactory *this,DescriptorPool *pool)

{
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_004e3710;
  this->pool_ = pool;
  this->delegate_to_generated_factory_ = false;
  (this->prototypes_)._M_h._M_buckets = &(this->prototypes_)._M_h._M_single_bucket;
  (this->prototypes_)._M_h._M_bucket_count = 1;
  (this->prototypes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->prototypes_)._M_h._M_element_count = 0;
  (this->prototypes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->prototypes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->prototypes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->prototypes_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->prototypes_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory(const DescriptorPool* pool)
    : pool_(pool), delegate_to_generated_factory_(false) {}